

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall FileTest_MoveCtor_Test::~FileTest_MoveCtor_Test(FileTest_MoveCtor_Test *this)

{
  void *in_RDI;
  
  ~FileTest_MoveCtor_Test((FileTest_MoveCtor_Test *)0x11a9b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FileTest, MoveCtor) {
  file f = open_file();
  int fd = f.descriptor();
  EXPECT_NE(-1, fd);
  file f2(std::move(f));
  EXPECT_EQ(fd, f2.descriptor());
  EXPECT_EQ(-1, f.descriptor());
}